

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O2

void __thiscall CVmObjHTTPRequest::load_image_data(CVmObjHTTPRequest *this,char *ptr,size_t siz)

{
  vm_httpreq_ext *pvVar1;
  
  (*(this->super_CVmObject)._vptr_CVmObject[2])(this,0);
  pvVar1 = vm_httpreq_ext::alloc_ext(this);
  (this->super_CVmObject).ext_ = (char *)pvVar1;
  return;
}

Assistant:

void CVmObjHTTPRequest::load_image_data(VMG_ const char *ptr, size_t siz)
{
    /* free our existing extension, if we have one */
    notify_delete(vmg_ FALSE);

    /* allocate the extension */
    vm_httpreq_ext *ext = vm_httpreq_ext::alloc_ext(vmg_ this);
    ext_ = (char *)ext;
}